

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_arena_lextents_print(emitter_t *emitter,uint i,uint64_t uptime)

{
  emitter_col_t *peVar1;
  int iVar2;
  int iVar3;
  tsd_t *tsd;
  tsd_t *ptVar4;
  undefined8 uVar5;
  ulong uVar6;
  emitter_col_t *peVar7;
  emitter_col_t *peVar8;
  char *pcVar9;
  uint64_t uVar10;
  size_t curlextents;
  uint64_t nrequests;
  size_t lextent_size;
  uint nlextents;
  uint64_t local_418;
  uint64_t uptime_s;
  size_t sz_5;
  uint64_t ndalloc;
  size_t miblen_new_2;
  uint nbins;
  emitter_col_t *local_3e8;
  uint64_t local_3e0;
  undefined8 local_3d8;
  size_t sz_6;
  emitter_col_t header_curlextents;
  emitter_col_t col_curlextents;
  emitter_col_t header_nrequests_ps;
  emitter_col_t col_nrequests_ps;
  emitter_col_t header_nrequests;
  emitter_col_t col_nrequests;
  emitter_col_t header_ndalloc_ps;
  emitter_col_t col_ndalloc_ps;
  emitter_col_t header_ndalloc;
  emitter_col_t col_ndalloc;
  emitter_col_t header_nmalloc_ps;
  emitter_col_t col_nmalloc_ps;
  emitter_col_t header_nmalloc;
  emitter_col_t col_nmalloc;
  emitter_col_t header_allocated;
  emitter_col_t col_allocated;
  size_t stats_arenas_mib [7];
  size_t arenas_lextent_mib [7];
  emitter_col_t col_ind;
  emitter_col_t header_size;
  emitter_col_t col_size;
  emitter_col_t header_ind;
  
  stats_arenas_mib[0] = 4;
  iVar2 = duckdb_je_mallctl("arenas.nbins",&nbins,stats_arenas_mib,(void *)0x0,0);
  if (iVar2 == 0) {
    stats_arenas_mib[0] = 4;
    iVar2 = duckdb_je_mallctl("arenas.nlextents",&nlextents,stats_arenas_mib,(void *)0x0,0);
    if (iVar2 == 0) {
      col_ind.link.qre_next = &col_size;
      col_size.justify = emitter_justify_right;
      col_size.width = 0x14;
      col_size.type = emitter_type_size;
      header_ind.link.qre_next = &header_size;
      header_size.justify = emitter_justify_right;
      header_size.width = 0x14;
      header_size.type = emitter_type_title;
      header_size.field_3.str_val = "size";
      col_size.link.qre_next = &col_ind;
      col_ind.justify = emitter_justify_right;
      col_ind.width = 4;
      col_ind.type = emitter_type_unsigned;
      header_size.link.qre_next = &header_ind;
      header_ind.justify = emitter_justify_right;
      header_ind.width = 4;
      header_ind.field_3.str_val = "ind";
      col_allocated.link.qre_next = &col_allocated;
      col_allocated.link.qre_prev = &col_allocated;
      col_size.link.qre_prev = col_size.link.qre_next;
      if (col_ind.link.qre_next != (emitter_col_t *)0x0) {
        col_allocated.link.qre_next = col_ind.link.qre_next;
        col_allocated.link.qre_prev = col_size.link.qre_next;
        col_size.link.qre_prev = &col_allocated;
      }
      col_allocated.justify = emitter_justify_right;
      col_allocated.width = 0xd;
      col_allocated.type = emitter_type_size;
      peVar7 = &header_allocated;
      header_allocated.link.qre_prev = &header_allocated;
      header_size.link.qre_prev = header_size.link.qre_next;
      if (header_ind.link.qre_next != (emitter_col_t *)0x0) {
        header_allocated.link.qre_prev = header_allocated.link.qre_next;
        ((header_allocated.link.qre_next)->link).qre_next = &header_allocated;
        peVar7 = header_size.link.qre_next;
        header_size.link.qre_prev = &header_allocated;
      }
      header_allocated.link.qre_next = peVar7;
      header_allocated.justify = emitter_justify_right;
      header_allocated.width = 0xd;
      header_allocated.type = emitter_type_title;
      header_allocated.field_3.str_val = "allocated";
      col_nmalloc.link.qre_prev = &col_nmalloc;
      col_ind.link.qre_prev = col_ind.link.qre_next;
      if (col_allocated.link.qre_next != (emitter_col_t *)0x0) {
        col_nmalloc.link.qre_prev = ((col_allocated.link.qre_next)->link).qre_prev;
        ((col_allocated.link.qre_next)->link).qre_prev = &col_nmalloc;
        ((((col_allocated.link.qre_next)->link).qre_prev)->link).qre_next =
             col_allocated.link.qre_next;
        ((col_nmalloc.link.qre_prev)->link).qre_next = &col_nmalloc;
      }
      col_nmalloc.link.qre_next = col_nmalloc.link.qre_prev;
      col_nmalloc.justify = emitter_justify_right;
      col_nmalloc.width = 0xd;
      col_nmalloc.type = emitter_type_uint64;
      header_nmalloc.link.qre_prev = &header_nmalloc;
      header_ind.type = header_size.type;
      header_ind.link.qre_prev = header_ind.link.qre_next;
      if (header_allocated.link.qre_next != (emitter_col_t *)0x0) {
        header_nmalloc.link.qre_prev = ((header_allocated.link.qre_next)->link).qre_prev;
        ((header_allocated.link.qre_next)->link).qre_prev = &header_nmalloc;
        ((((header_allocated.link.qre_next)->link).qre_prev)->link).qre_next =
             header_allocated.link.qre_next;
        ((header_nmalloc.link.qre_prev)->link).qre_next = &header_nmalloc;
      }
      header_nmalloc.link.qre_next = header_nmalloc.link.qre_prev;
      header_nmalloc.justify = emitter_justify_right;
      header_nmalloc.width = 0xd;
      header_nmalloc.type = emitter_type_title;
      header_nmalloc.field_3.str_val = "nmalloc";
      col_nmalloc_ps.link.qre_prev = &col_nmalloc_ps;
      if (col_nmalloc.link.qre_prev != (emitter_col_t *)0x0) {
        col_nmalloc_ps.link.qre_prev = ((col_nmalloc.link.qre_prev)->link).qre_prev;
        ((col_nmalloc.link.qre_prev)->link).qre_prev = &col_nmalloc_ps;
        ((((col_nmalloc.link.qre_next)->link).qre_prev)->link).qre_next = col_nmalloc.link.qre_next;
        ((col_nmalloc_ps.link.qre_prev)->link).qre_next = &col_nmalloc_ps;
      }
      col_nmalloc_ps.link.qre_next = col_nmalloc_ps.link.qre_prev;
      col_nmalloc_ps.justify = emitter_justify_right;
      col_nmalloc_ps.width = 8;
      col_nmalloc_ps.type = emitter_type_uint64;
      header_nmalloc_ps.link.qre_prev = &header_nmalloc_ps;
      if (header_nmalloc.link.qre_prev != (emitter_col_t *)0x0) {
        header_nmalloc_ps.link.qre_prev = ((header_nmalloc.link.qre_prev)->link).qre_prev;
        ((header_nmalloc.link.qre_prev)->link).qre_prev = &header_nmalloc_ps;
        ((((header_nmalloc.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nmalloc.link.qre_next;
        ((header_nmalloc_ps.link.qre_prev)->link).qre_next = &header_nmalloc_ps;
      }
      header_nmalloc_ps.link.qre_next = header_nmalloc_ps.link.qre_prev;
      header_nmalloc_ps.justify = emitter_justify_right;
      header_nmalloc_ps.width = 8;
      header_nmalloc_ps.type = emitter_type_title;
      header_nmalloc_ps.field_3.str_val = "(#/sec)";
      col_ndalloc.link.qre_prev = &col_ndalloc;
      if (col_nmalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_ndalloc.link.qre_prev = ((col_nmalloc_ps.link.qre_prev)->link).qre_prev;
        ((col_nmalloc_ps.link.qre_prev)->link).qre_prev = &col_ndalloc;
        ((((col_nmalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nmalloc_ps.link.qre_next;
        ((col_ndalloc.link.qre_prev)->link).qre_next = &col_ndalloc;
      }
      col_ndalloc.link.qre_next = col_ndalloc.link.qre_prev;
      col_ndalloc.justify = emitter_justify_right;
      col_ndalloc.width = 0xd;
      col_ndalloc.type = emitter_type_uint64;
      header_ndalloc.link.qre_prev = &header_ndalloc;
      if (header_nmalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_ndalloc.link.qre_prev = ((header_nmalloc_ps.link.qre_prev)->link).qre_prev;
        ((header_nmalloc_ps.link.qre_prev)->link).qre_prev = &header_ndalloc;
        ((((header_nmalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nmalloc_ps.link.qre_next;
        ((header_ndalloc.link.qre_prev)->link).qre_next = &header_ndalloc;
      }
      header_ndalloc.link.qre_next = header_ndalloc.link.qre_prev;
      header_ndalloc.justify = emitter_justify_right;
      header_ndalloc.width = 0xd;
      header_ndalloc.type = emitter_type_title;
      header_ndalloc.field_3.str_val = "ndalloc";
      col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
      if (col_ndalloc.link.qre_prev != (emitter_col_t *)0x0) {
        col_ndalloc_ps.link.qre_prev = ((col_ndalloc.link.qre_prev)->link).qre_prev;
        ((col_ndalloc.link.qre_prev)->link).qre_prev = &col_ndalloc_ps;
        ((((col_ndalloc.link.qre_next)->link).qre_prev)->link).qre_next = col_ndalloc.link.qre_next;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_next = &col_ndalloc_ps;
      }
      col_ndalloc_ps.link.qre_next = col_ndalloc_ps.link.qre_prev;
      col_ndalloc_ps.justify = emitter_justify_right;
      col_ndalloc_ps.width = 8;
      col_ndalloc_ps.type = emitter_type_uint64;
      header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
      if (header_ndalloc.link.qre_prev != (emitter_col_t *)0x0) {
        header_ndalloc_ps.link.qre_prev = ((header_ndalloc.link.qre_prev)->link).qre_prev;
        ((header_ndalloc.link.qre_prev)->link).qre_prev = &header_ndalloc_ps;
        ((((header_ndalloc.link.qre_next)->link).qre_prev)->link).qre_next =
             header_ndalloc.link.qre_next;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_next = &header_ndalloc_ps;
      }
      header_ndalloc_ps.link.qre_next = header_ndalloc_ps.link.qre_prev;
      header_ndalloc_ps.justify = emitter_justify_right;
      header_ndalloc_ps.width = 8;
      header_ndalloc_ps.type = emitter_type_title;
      header_ndalloc_ps.field_3.str_val = "(#/sec)";
      col_nrequests.link.qre_prev = &col_nrequests;
      if (col_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nrequests.link.qre_prev = ((col_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_prev = &col_nrequests;
        ((((col_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_ndalloc_ps.link.qre_next;
        ((col_nrequests.link.qre_prev)->link).qre_next = &col_nrequests;
      }
      col_nrequests.link.qre_next = col_nrequests.link.qre_prev;
      col_nrequests.justify = emitter_justify_right;
      col_nrequests.width = 0xd;
      col_nrequests.type = emitter_type_uint64;
      header_nrequests.link.qre_prev = &header_nrequests;
      if (header_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nrequests.link.qre_prev = ((header_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_prev = &header_nrequests;
        ((((header_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_ndalloc_ps.link.qre_next;
        ((header_nrequests.link.qre_prev)->link).qre_next = &header_nrequests;
      }
      header_nrequests.link.qre_next = header_nrequests.link.qre_prev;
      header_nrequests.justify = emitter_justify_right;
      header_nrequests.width = 0xd;
      header_nrequests.type = emitter_type_title;
      header_nrequests.field_3.str_val = "nrequests";
      col_nrequests_ps.link.qre_prev = &col_nrequests_ps;
      if (col_nrequests.link.qre_prev != (emitter_col_t *)0x0) {
        col_nrequests_ps.link.qre_prev = ((col_nrequests.link.qre_prev)->link).qre_prev;
        ((col_nrequests.link.qre_prev)->link).qre_prev = &col_nrequests_ps;
        ((((col_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests.link.qre_next;
        ((col_nrequests_ps.link.qre_prev)->link).qre_next = &col_nrequests_ps;
      }
      col_nrequests_ps.link.qre_next = col_nrequests_ps.link.qre_prev;
      col_nrequests_ps.justify = emitter_justify_right;
      col_nrequests_ps.width = 8;
      col_nrequests_ps.type = emitter_type_uint64;
      header_nrequests_ps.link.qre_prev = &header_nrequests_ps;
      if (header_nrequests.link.qre_prev != (emitter_col_t *)0x0) {
        header_nrequests_ps.link.qre_prev = ((header_nrequests.link.qre_prev)->link).qre_prev;
        ((header_nrequests.link.qre_prev)->link).qre_prev = &header_nrequests_ps;
        ((((header_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests.link.qre_next;
        ((header_nrequests_ps.link.qre_prev)->link).qre_next = &header_nrequests_ps;
      }
      header_nrequests_ps.link.qre_next = header_nrequests_ps.link.qre_prev;
      header_nrequests_ps.justify = emitter_justify_right;
      header_nrequests_ps.width = 8;
      header_nrequests_ps.type = emitter_type_title;
      header_nrequests_ps.field_3.str_val = "(#/sec)";
      col_curlextents.link.qre_prev = &col_curlextents;
      if (col_nrequests_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_curlextents.link.qre_prev = ((col_nrequests_ps.link.qre_prev)->link).qre_prev;
        ((col_nrequests_ps.link.qre_prev)->link).qre_prev = &col_curlextents;
        ((((col_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests_ps.link.qre_next;
        ((col_curlextents.link.qre_prev)->link).qre_next = &col_curlextents;
      }
      peVar7 = col_curlextents.link.qre_prev;
      col_curlextents.justify = emitter_justify_right;
      col_curlextents.width = 0xd;
      col_curlextents.type = emitter_type_size;
      header_curlextents.link.qre_prev = &header_curlextents;
      if (header_nrequests_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_curlextents.link.qre_prev = ((header_nrequests_ps.link.qre_prev)->link).qre_prev;
        ((header_nrequests_ps.link.qre_prev)->link).qre_prev = &header_curlextents;
        ((((header_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests_ps.link.qre_next;
        ((header_curlextents.link.qre_prev)->link).qre_next = &header_curlextents;
      }
      peVar1 = header_curlextents.link.qre_prev;
      header_curlextents.justify = emitter_justify_right;
      header_curlextents.width = 0xd;
      header_curlextents.type = emitter_type_title;
      header_curlextents.field_3.str_val = "curlextents";
      header_size.width = header_size.width + -6;
      local_418 = uptime;
      header_curlextents.link.qre_next = header_curlextents.link.qre_prev;
      col_curlextents.link.qre_next = col_curlextents.link.qre_prev;
      emitter_table_printf(emitter,"large:");
      if (emitter->output == emitter_output_table) {
        if (peVar1 != (emitter_col_t *)0x0) {
          peVar8 = peVar1;
          do {
            emitter_print_value(emitter,peVar8->justify,peVar8->width,peVar8->type,&peVar8->field_3)
            ;
            peVar8 = (peVar8->link).qre_next;
            if (peVar8 == peVar1) {
              peVar8 = (emitter_col_t *)0x0;
            }
          } while (peVar8 != (emitter_col_t *)0x0);
        }
        emitter_table_printf(emitter,anon_var_dwarf_63fc88c + 8);
      }
      emitter_json_array_kv_begin(emitter,"lextents");
      arenas_lextent_mib[0] = 7;
      tsd = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
      ptVar4 = tsd;
      if ((tsd->state).repr != '\0') {
        ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      iVar2 = duckdb_je_ctl_mibnametomib
                        (ptVar4,stats_arenas_mib,0,"stats.arenas",arenas_lextent_mib);
      uVar10 = local_418;
      if (iVar2 == 0) {
        arenas_lextent_mib[0] = 7;
        ptVar4 = tsd;
        stats_arenas_mib[2] = (ulong)i;
        if ((tsd->state).repr != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar2 = duckdb_je_ctl_mibnametomib(ptVar4,stats_arenas_mib,3,"lextents",arenas_lextent_mib);
        if (iVar2 == 0) {
          miblen_new_2 = 7;
          ptVar4 = tsd;
          if ((tsd->state).repr != '\0') {
            ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
          }
          iVar2 = duckdb_je_ctl_mibnametomib
                            (ptVar4,arenas_lextent_mib,0,"arenas.lextent",&miblen_new_2);
          if (iVar2 == 0) {
            if (nlextents == 0) {
              uVar5 = 0;
            }
            else {
              uptime_s = uVar10 / 1000000000;
              uVar6 = 0;
              local_3e8 = peVar7;
              uVar5 = 0;
              do {
                ndalloc = 7;
                nrequests = 8;
                ptVar4 = tsd;
                stats_arenas_mib[4] = uVar6;
                arenas_lextent_mib[2] = uVar6;
                if ((tsd->state).repr != '\0') {
                  ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar4,stats_arenas_mib,5,"nmalloc",&ndalloc,&miblen_new_2,
                                   &nrequests,(void *)0x0,0);
                if (iVar2 != 0) {
LAB_00d0bc58:
                  pcVar9 = "<jemalloc>: Failure in ctl_bymibname()\n";
                  goto LAB_00d0bc5f;
                }
                nrequests = 7;
                lextent_size = 8;
                ptVar4 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar4,stats_arenas_mib,5,"ndalloc",&nrequests,&ndalloc,
                                   &lextent_size,(void *)0x0,0);
                if (iVar2 != 0) goto LAB_00d0bc58;
                lextent_size = 7;
                curlextents = 8;
                ptVar4 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar4,stats_arenas_mib,5,"nrequests",&lextent_size,&nrequests,
                                   &curlextents,(void *)0x0,0);
                if (iVar2 != 0) goto LAB_00d0bc58;
                local_3e0 = nrequests;
                local_3d8 = CONCAT71((int7)(nrequests >> 8),nrequests == 0);
                if ((~(byte)uVar5 & 1) == 0 && nrequests != 0) {
                  emitter_table_printf(emitter,"                     ---\n");
                }
                curlextents = 7;
                sz_5 = 8;
                ptVar4 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar4,arenas_lextent_mib,3,"size",&curlextents,&lextent_size,
                                   &sz_5,(void *)0x0,0);
                if (iVar2 != 0) goto LAB_00d0bc58;
                sz_5 = 7;
                sz_6 = 8;
                ptVar4 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar4 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar4,stats_arenas_mib,5,"curlextents",&sz_5,&curlextents,&sz_6,
                                   (void *)0x0,0);
                if (iVar2 != 0) goto LAB_00d0bc58;
                if (emitter->output < emitter_output_table) {
                  if (emitter->emitted_key == true) {
                    emitter->emitted_key = false;
                  }
                  else {
                    if (emitter->item_at_depth == true) {
                      emitter_printf(emitter,",");
                    }
                    if (emitter->output != emitter_output_json_compact) {
                      emitter_printf(emitter,anon_var_dwarf_63fc88c + 8);
                      pcVar9 = anon_var_dwarf_63fcc6d + 7;
                      if (emitter->output != emitter_output_json) {
                        pcVar9 = " ";
                      }
                      if (0 < emitter->nesting_depth) {
                        iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                        if (iVar2 < 2) {
                          iVar2 = 1;
                        }
                        do {
                          emitter_printf(emitter,"%s",pcVar9);
                          iVar2 = iVar2 + -1;
                        } while (iVar2 != 0);
                      }
                    }
                  }
                  emitter_printf(emitter,"{");
                  emitter->nesting_depth = emitter->nesting_depth + 1;
                  emitter->item_at_depth = false;
                  peVar7 = local_3e8;
                  uVar10 = local_418;
                }
                emitter_json_kv(emitter,"curlextents",emitter_type_size,&curlextents);
                if (emitter->output < emitter_output_table) {
                  emitter->nesting_depth = emitter->nesting_depth + -1;
                  emitter->item_at_depth = true;
                  if (emitter->output != emitter_output_json_compact) {
                    emitter_printf(emitter,anon_var_dwarf_63fc88c + 8);
                    pcVar9 = anon_var_dwarf_63fcc6d + 7;
                    if (emitter->output != emitter_output_json) {
                      pcVar9 = " ";
                    }
                    if (0 < emitter->nesting_depth) {
                      iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                      if (iVar2 < 2) {
                        iVar2 = 1;
                      }
                      do {
                        emitter_printf(emitter,"%s",pcVar9);
                        iVar2 = iVar2 + -1;
                      } while (iVar2 != 0);
                    }
                  }
                  emitter_printf(emitter,"}");
                  peVar7 = local_3e8;
                  uVar10 = local_418;
                }
                col_ind.field_3.int_val = nbins + (int)uVar6;
                col_allocated.field_3.uint64_val = curlextents * lextent_size;
                col_size.field_3.size_val = lextent_size;
                col_nmalloc.field_3.size_val = miblen_new_2;
                col_nmalloc_ps.field_3.size_val = miblen_new_2;
                if (uVar10 == 0) {
                  col_nmalloc_ps.field_3.uint64_val = 0;
                }
                if (miblen_new_2 != 0 && 999999999 < uVar10) {
                  col_nmalloc_ps.field_3.uint64_val = miblen_new_2 / uptime_s;
                }
                col_ndalloc.field_3.uint64_val = ndalloc;
                col_ndalloc_ps.field_3.uint64_val = ndalloc;
                if (uVar10 == 0) {
                  col_ndalloc_ps.field_3.uint64_val = 0;
                }
                if (ndalloc != 0 && 999999999 < uVar10) {
                  col_ndalloc_ps.field_3.uint64_val = ndalloc / uptime_s;
                }
                col_nrequests.field_3.uint64_val = nrequests;
                col_nrequests_ps.field_3.uint64_val = nrequests;
                if (uVar10 == 0) {
                  col_nrequests_ps.field_3.uint64_val = 0;
                }
                if (nrequests != 0 && 999999999 < uVar10) {
                  col_nrequests_ps.field_3.uint64_val = nrequests / uptime_s;
                }
                col_curlextents.field_3.size_val = curlextents;
                if ((local_3e0 != 0) && (peVar1 = peVar7, emitter->output == emitter_output_table))
                {
                  while (peVar1 != (emitter_col_t *)0x0) {
                    emitter_print_value(emitter,peVar1->justify,peVar1->width,peVar1->type,
                                        &peVar1->field_3);
                    peVar8 = (peVar1->link).qre_next;
                    peVar1 = (emitter_col_t *)0x0;
                    if (peVar8 != peVar7) {
                      peVar1 = peVar8;
                    }
                  }
                  emitter_table_printf(emitter,anon_var_dwarf_63fc88c + 8);
                  uVar10 = local_418;
                }
                uVar6 = uVar6 + 1;
                uVar5 = local_3d8;
              } while (uVar6 < nlextents);
            }
            if (emitter->output < emitter_output_table) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              if (emitter->output != emitter_output_json_compact) {
                emitter_printf(emitter,anon_var_dwarf_63fc88c + 8);
                pcVar9 = anon_var_dwarf_63fcc6d + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar9 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar3 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar2 = 1;
                  if (1 < iVar3) {
                    iVar2 = iVar3;
                  }
                  do {
                    emitter_printf(emitter,"%s",pcVar9);
                    iVar2 = iVar2 + -1;
                  } while (iVar2 != 0);
                }
              }
              emitter_printf(emitter,"]");
            }
            if ((char)uVar5 != '\0') {
              emitter_table_printf(emitter,"                     ---\n");
            }
            return;
          }
        }
      }
      pcVar9 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
LAB_00d0bc5f:
      duckdb_je_malloc_write(pcVar9);
      abort();
    }
    pcVar9 = "arenas.nlextents";
  }
  else {
    pcVar9 = "arenas.nbins";
  }
  duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar9);
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_lextents_print(emitter_t *emitter, unsigned i, uint64_t uptime) {
	unsigned nbins, nlextents, j;
	bool in_gap, in_gap_prev;

	CTL_GET("arenas.nbins", &nbins, unsigned);
	CTL_GET("arenas.nlextents", &nlextents, unsigned);

	emitter_row_t header_row;
	emitter_row_init(&header_row);
	emitter_row_t row;
	emitter_row_init(&row);

	bool prof_stats_on = config_prof && opt_prof && opt_prof_stats
	    && i == MALLCTL_ARENAS_ALL;

	COL_HDR(row, size, NULL, right, 20, size)
	COL_HDR(row, ind, NULL, right, 4, unsigned)
	COL_HDR(row, allocated, NULL, right, 13, size)
	COL_HDR(row, nmalloc, NULL, right, 13, uint64)
	COL_HDR(row, nmalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, ndalloc, NULL, right, 13, uint64)
	COL_HDR(row, ndalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nrequests, NULL, right, 13, uint64)
	COL_HDR(row, nrequests_ps, "(#/sec)", right, 8, uint64)
	COL_HDR_DECLARE(prof_live_requested)
	COL_HDR_DECLARE(prof_live_count)
	COL_HDR_DECLARE(prof_accum_requested)
	COL_HDR_DECLARE(prof_accum_count)
	if (prof_stats_on) {
		COL_HDR_INIT(row, prof_live_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_live_count, NULL, right, 17, uint64)
		COL_HDR_INIT(row, prof_accum_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_accum_count, NULL, right, 17, uint64)
	}
	COL_HDR(row, curlextents, NULL, right, 13, size)

	/* As with bins, we label the large extents table. */
	header_size.width -= 6;
	emitter_table_printf(emitter, "large:");
	emitter_table_row(emitter, &header_row);
	emitter_json_array_kv_begin(emitter, "lextents");

	size_t stats_arenas_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(stats_arenas_mib, 0, "stats.arenas");
	stats_arenas_mib[2] = i;
	CTL_LEAF_PREPARE(stats_arenas_mib, 3, "lextents");

	size_t arenas_lextent_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(arenas_lextent_mib, 0, "arenas.lextent");

	size_t prof_stats_mib[CTL_MAX_DEPTH];
	if (prof_stats_on) {
		CTL_LEAF_PREPARE(prof_stats_mib, 0, "prof.stats.lextents");
	}

	for (j = 0, in_gap = false; j < nlextents; j++) {
		uint64_t nmalloc, ndalloc, nrequests;
		size_t lextent_size, curlextents;
		prof_stats_t prof_live;
		prof_stats_t prof_accum;

		stats_arenas_mib[4] = j;
		arenas_lextent_mib[2] = j;

		CTL_LEAF(stats_arenas_mib, 5, "nmalloc", &nmalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "ndalloc", &ndalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nrequests", &nrequests,
		    uint64_t);

		in_gap_prev = in_gap;
		in_gap = (nrequests == 0);

		if (in_gap_prev && !in_gap) {
			emitter_table_printf(emitter,
			    "                     ---\n");
		}

		CTL_LEAF(arenas_lextent_mib, 3, "size", &lextent_size, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "curlextents", &curlextents,
		    size_t);

		if (prof_stats_on) {
			prof_stats_mib[3] = j;
			CTL_LEAF(prof_stats_mib, 4, "live", &prof_live,
			    prof_stats_t);
			CTL_LEAF(prof_stats_mib, 4, "accum", &prof_accum,
			    prof_stats_t);
		}

		emitter_json_object_begin(emitter);
		if (prof_stats_on) {
			emitter_json_kv(emitter, "prof_live_requested",
			    emitter_type_uint64, &prof_live.req_sum);
			emitter_json_kv(emitter, "prof_live_count",
			    emitter_type_uint64, &prof_live.count);
			emitter_json_kv(emitter, "prof_accum_requested",
			    emitter_type_uint64, &prof_accum.req_sum);
			emitter_json_kv(emitter, "prof_accum_count",
			    emitter_type_uint64, &prof_accum.count);
		}
		emitter_json_kv(emitter, "curlextents", emitter_type_size,
		    &curlextents);
		emitter_json_object_end(emitter);

		col_size.size_val = lextent_size;
		col_ind.unsigned_val = nbins + j;
		col_allocated.size_val = curlextents * lextent_size;
		col_nmalloc.uint64_val = nmalloc;
		col_nmalloc_ps.uint64_val = rate_per_second(nmalloc, uptime);
		col_ndalloc.uint64_val = ndalloc;
		col_ndalloc_ps.uint64_val = rate_per_second(ndalloc, uptime);
		col_nrequests.uint64_val = nrequests;
		col_nrequests_ps.uint64_val = rate_per_second(nrequests, uptime);
		if (prof_stats_on) {
			col_prof_live_requested.uint64_val = prof_live.req_sum;
			col_prof_live_count.uint64_val = prof_live.count;
			col_prof_accum_requested.uint64_val =
			    prof_accum.req_sum;
			col_prof_accum_count.uint64_val = prof_accum.count;
		}
		col_curlextents.size_val = curlextents;

		if (!in_gap) {
			emitter_table_row(emitter, &row);
		}
	}
	emitter_json_array_end(emitter); /* Close "lextents". */
	if (in_gap) {
		emitter_table_printf(emitter, "                     ---\n");
	}
}